

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *type)

{
  int iVar1;
  t_type *ptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  undefined8 *puVar3;
  allocator *paVar4;
  char *pcVar5;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  ptVar2 = t_type::get_true_type(type);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0')) {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
          if ((char)iVar1 == '\0') {
            iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
            if ((char)iVar1 == '\0') goto switchD_0020e567_default;
            pcVar5 = "org.apache.thrift.protocol.TType.LIST";
            paVar4 = &local_1c;
          }
          else {
            pcVar5 = "org.apache.thrift.protocol.TType.SET";
            paVar4 = &local_1b;
          }
        }
        else {
          pcVar5 = "org.apache.thrift.protocol.TType.MAP";
          paVar4 = &local_1a;
        }
      }
      else {
        pcVar5 = "org.apache.thrift.protocol.TType.STRUCT";
        paVar4 = &local_19;
      }
    }
    else {
      pcVar5 = "org.apache.thrift.protocol.TType.I32";
      paVar4 = &local_18;
    }
  }
  else {
    switch(*(undefined4 *)&ptVar2[1].super_t_doc._vptr_t_doc) {
    case 0:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    case 1:
      pcVar5 = "org.apache.thrift.protocol.TType.STRING";
      paVar4 = &local_11;
      break;
    case 2:
      pcVar5 = "org.apache.thrift.protocol.TType.BOOL";
      paVar4 = &local_12;
      break;
    case 3:
      pcVar5 = "org.apache.thrift.protocol.TType.BYTE";
      paVar4 = &local_13;
      break;
    case 4:
      pcVar5 = "org.apache.thrift.protocol.TType.I16";
      paVar4 = &local_14;
      break;
    case 5:
      pcVar5 = "org.apache.thrift.protocol.TType.I32";
      paVar4 = &local_15;
      break;
    case 6:
      pcVar5 = "org.apache.thrift.protocol.TType.I64";
      paVar4 = &local_16;
      break;
    case 7:
      pcVar5 = "org.apache.thrift.protocol.TType.DOUBLE";
      paVar4 = &local_17;
      break;
    default:
switchD_0020e567_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,paVar4);
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "NO T_VOID CONSTRUCT";
    case t_base_type::TYPE_STRING:
      return "org.apache.thrift.protocol.TType.STRING";
    case t_base_type::TYPE_BOOL:
      return "org.apache.thrift.protocol.TType.BOOL";
    case t_base_type::TYPE_I8:
      return "org.apache.thrift.protocol.TType.BYTE";
    case t_base_type::TYPE_I16:
      return "org.apache.thrift.protocol.TType.I16";
    case t_base_type::TYPE_I32:
      return "org.apache.thrift.protocol.TType.I32";
    case t_base_type::TYPE_I64:
      return "org.apache.thrift.protocol.TType.I64";
    case t_base_type::TYPE_DOUBLE:
      return "org.apache.thrift.protocol.TType.DOUBLE";
    }
  } else if (type->is_enum()) {
    return "org.apache.thrift.protocol.TType.I32";
  } else if (type->is_struct() || type->is_xception()) {
    return "org.apache.thrift.protocol.TType.STRUCT";
  } else if (type->is_map()) {
    return "org.apache.thrift.protocol.TType.MAP";
  } else if (type->is_set()) {
    return "org.apache.thrift.protocol.TType.SET";
  } else if (type->is_list()) {
    return "org.apache.thrift.protocol.TType.LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}